

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpl_grammar.h
# Opt level: O0

void __thiscall
VPLGrammar::Parser::AdditiveExpressionNode::BuildProgram
          (AdditiveExpressionNode *this,Scope *scope,ostream *out)

{
  int iVar1;
  const_reference pvVar2;
  pointer pAVar3;
  size_type sVar4;
  vector<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>,_std::allocator<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>_>_>
  *this_00;
  ulong local_28;
  size_t i;
  ostream *out_local;
  Scope *scope_local;
  AdditiveExpressionNode *this_local;
  
  pvVar2 = std::
           vector<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>,_std::allocator<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>_>_>
           ::operator[](&(this->super_ASTNodeBasic).children_,0);
  pAVar3 = std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>
           ::operator->(pvVar2);
  (*pAVar3->_vptr_ASTNodeBasic[5])(pAVar3,scope,out);
  for (local_28 = 2;
      sVar4 = std::
              vector<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>,_std::allocator<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>_>_>
              ::size(&(this->super_ASTNodeBasic).children_), local_28 < sVar4;
      local_28 = local_28 + 2) {
    this_00 = &(this->super_ASTNodeBasic).children_;
    pvVar2 = std::
             vector<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>,_std::allocator<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>_>_>
             ::operator[](this_00,local_28);
    pAVar3 = std::
             unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>::
             operator->(pvVar2);
    (*pAVar3->_vptr_ASTNodeBasic[5])(pAVar3,scope,out);
    std::operator<<(out,"    ");
    pvVar2 = std::
             vector<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>,_std::allocator<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>_>_>
             ::operator[](this_00,local_28 - 1);
    pAVar3 = std::
             unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>::
             operator->(pvVar2);
    iVar1 = (*pAVar3->_vptr_ASTNodeBasic[2])();
    if (iVar1 == 0x2f) {
      std::operator<<(out,"    add\n");
    }
    else if (iVar1 == 0x30) {
      std::operator<<(out,"    sub\n");
    }
    std::operator<<(out,'\n');
    vpl::Scope::Pop(scope);
  }
  return;
}

Assistant:

virtual void BuildProgram(vpl::Scope* scope, std::ostream& out) const override {
                children_[0]->BuildProgram(scope, out);
                for (size_t i = 2; i < children_.size(); i += 2) {
                    children_[i]->BuildProgram(scope, out);
                    out << "    ";
                    switch(children_[i - 1]->GetType()) {
                        case kPlusType:
                            out << "    add\n";
                            break;
                        case kMinusType:
                            out << "    sub\n";
                            break;
                    }
                    out << '\n';
                    scope->Pop();
                }
            }